

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_entry.c
# Opt level: O0

void archive_entry_copy_symlink(archive_entry *entry,char *linkname)

{
  char *linkname_local;
  archive_entry *entry_local;
  
  if ((linkname != (char *)0x0) || ((entry->ae_set & 1U) == 0)) {
    archive_mstring_copy_mbs(&entry->ae_linkname,linkname);
    entry->ae_set = entry->ae_set & 0xfffffffe;
    if (linkname == (char *)0x0) {
      entry->ae_set = entry->ae_set & 0xfffffffd;
    }
    else {
      entry->ae_set = entry->ae_set | 2;
    }
  }
  return;
}

Assistant:

void
archive_entry_copy_symlink(struct archive_entry *entry, const char *linkname)
{
	if (linkname == NULL && (entry->ae_set & AE_SET_HARDLINK))
		return;
	archive_mstring_copy_mbs(&entry->ae_linkname, linkname);
	entry->ae_set &= ~AE_SET_HARDLINK;
	if (linkname == NULL)
		entry->ae_set &= ~AE_SET_SYMLINK;
	else
		entry->ae_set |= AE_SET_SYMLINK;
}